

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  ~IfcProcess((IfcProcess *)
              (&(this->super_IfcObject).field_0x0 +
              *(long *)(*(long *)&this->super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}